

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

int SDL_BuildAudioCVT(SDL12_AudioCVT *cvt12,Uint16 src_format,Uint8 src_channels,int src_rate,
                     Uint16 dst_format,Uint8 dst_channels,int dst_rate)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  SDL_AudioCVT cvt20;
  
  (*SDL20_memset)(cvt12,0,0x88);
  if (WantCompatibilityAudioCVT == SDL_FALSE) {
    iVar4 = (*SDL20_BuildAudioCVT)
                      (&cvt20,src_format,src_channels,src_rate,dst_format,dst_channels,dst_rate);
    AudioCVT20to12(&cvt20,cvt12);
    return iVar4;
  }
  if ((src_channels == dst_channels && src_format == dst_format) && src_rate == dst_rate) {
    return 0;
  }
  cvt12->needed = 1;
  cvt12->len_mult = 1;
  cvt12->len_ratio = 1.0;
  cvt12->src_format = src_format;
  cvt12->dst_format = dst_format;
  if (src_channels == dst_channels && src_format == dst_format) {
    dVar6 = 1.0;
    iVar4 = 1;
    goto LAB_001132cc;
  }
  if (src_format == dst_format) {
    dVar6 = 1.0;
    iVar4 = 1;
  }
  else {
    if ((src_format & 0xff) < (dst_format & 0xff)) {
      iVar4 = 2;
      cvt12->len_mult = 2;
      dVar6 = 2.0;
    }
    else {
      iVar4 = 1;
      dVar6 = 0.5;
    }
    cvt12->len_ratio = dVar6;
  }
  if (src_channels < dst_channels) {
    iVar4 = iVar4 * (uint)(dst_channels / src_channels);
    cvt12->len_mult = iVar4;
    dVar6 = dVar6 * (double)(dst_channels / src_channels);
LAB_001132a7:
    cvt12->len_ratio = dVar6;
  }
  else if (dst_channels < src_channels) {
    dVar6 = dVar6 / (double)(src_channels / dst_channels);
    goto LAB_001132a7;
  }
  iVar5 = cvt12->filter_index;
  cvt12->filter_index = iVar5 + 1;
  cvt12->filters[iVar5] = CompatibilityCVT_RunStream;
  cvt12->filters[9] = (SDL12_AudioCVTFilter)(ulong)CONCAT11(dst_channels,src_channels);
LAB_001132cc:
  if (src_rate != dst_rate) {
    if (src_rate < dst_rate) {
      dVar7 = 2.0;
      iVar5 = 2;
      uVar2 = dst_rate;
      uVar3 = src_rate;
    }
    else {
      dVar7 = 0.5;
      iVar5 = 1;
      uVar2 = src_rate;
      uVar3 = dst_rate;
    }
    while( true ) {
      uVar3 = uVar3 * 2;
      if ((uint)((ulong)uVar2 / 100) < uVar3 / 100) break;
      iVar1 = cvt12->filter_index;
      if (7 < (long)iVar1) {
        iVar4 = (*SDL20_SetError)("Too many conversion filters needed",(ulong)uVar2 / 100,
                                  (ulong)uVar3 % 100,SDL20_SetError);
        return iVar4;
      }
      cvt12->filter_index = iVar1 + 1;
      cvt12->filters[iVar1] = CompatibilityCVT_Resampler;
      iVar4 = iVar4 * iVar5;
      cvt12->len_mult = iVar4;
      dVar6 = dVar6 * dVar7;
      cvt12->len_ratio = dVar6;
    }
    cvt12->rate_incr = (double)src_rate / (double)dst_rate;
  }
  return 1;
}

Assistant:

SDLCALL
SDL_BuildAudioCVT(SDL12_AudioCVT *cvt12, Uint16 src_format, Uint8 src_channels, int src_rate, Uint16 dst_format, Uint8 dst_channels, int dst_rate)
{
    int retval = 0;

    SDL20_zerop(cvt12); /* SDL 1.2 derefences cvt12 without checking for NULL */

    if (!WantCompatibilityAudioCVT) {
        SDL_AudioCVT cvt20;
        retval = SDL20_BuildAudioCVT(&cvt20, src_format, src_channels, src_rate, dst_format, dst_channels, dst_rate);
        AudioCVT20to12(&cvt20, cvt12);
    } else {
        const size_t channel_mash = ((size_t) src_channels) | (((size_t) dst_channels) << 8);

        if ((src_format == dst_format) && (src_channels == dst_channels) && (src_rate == dst_rate)) {
            return 0;  /* no conversion needed. */
        }

        cvt12->needed = 1;
        cvt12->len_mult = 1;
        cvt12->len_ratio = 1.0;
        cvt12->src_format = src_format;
        cvt12->dst_format = dst_format;

        if ((src_format != dst_format) || (src_channels != dst_channels)) {
            if (src_format != dst_format) {
                /* there are only 8 and 16 bit formats in SDL 1.2 */
                if (SDL_AUDIO_BITSIZE(src_format) < SDL_AUDIO_BITSIZE(dst_format)) {
                    cvt12->len_mult *= 2;
                    cvt12->len_ratio *= 2.0;
                } else {
                    cvt12->len_ratio /= 2.0;
                }
            }

            /* SDL 1.2 only supported 1, 2, 4, and 6 channels, and would fail to convert between 4 and 6 at all. :O */
            if (src_channels < dst_channels) {
                const int diff = (int) (dst_channels / src_channels);
                cvt12->len_mult *= diff;
                cvt12->len_ratio *= (double) diff;
            } else if (src_channels > dst_channels) {
                const int diff = (int) (src_channels / dst_channels);
                cvt12->len_ratio /= (double) diff;
            }

            cvt12->filters[cvt12->filter_index++] = CompatibilityCVT_RunStream;
            cvt12->filters[SDL_arraysize(cvt12->filters) - 1] = (SDL12_AudioCVTFilter) channel_mash;  /* cheat by hiding this info at end of array. */
        }

        if (src_rate != dst_rate) {
            Uint32 hi_rate = src_rate;
            Uint32 lo_rate = dst_rate;
            int len_mult = 1;
            double len_ratio = 0.5;

            if (src_rate < dst_rate) {  /* flip everything. */
                hi_rate = dst_rate;
                lo_rate = src_rate;
                len_mult = 2;
                len_ratio = 2.0;
            }

            while (((lo_rate * 2) / 100) <= (hi_rate / 100)) {   /* this is what SDL 1.2 does. *shrug* */
                if (cvt12->filter_index >= (int)(SDL_arraysize(cvt12->filters) - 2)) {
                    return SDL20_SetError("Too many conversion filters needed");
                }
                cvt12->filters[cvt12->filter_index++] = CompatibilityCVT_Resampler;
                cvt12->len_mult *= len_mult;
                lo_rate *= 2;
                cvt12->len_ratio *= len_ratio;
            }

            cvt12->rate_incr = ((double) src_rate) / ((double) dst_rate);
        }

        retval = 1;  /* conversion definitely needed. */
    }

    return retval;
}